

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O2

void __thiscall
Diligent::
ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
::BindResources(ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                *this,IResourceMapping *pResourceMapping,BIND_SHADER_RESOURCES_FLAGS Flags)

{
  int iVar1;
  PipelineResourceDesc *ResDesc;
  IDeviceObject *pIVar2;
  undefined4 extraout_var;
  char (*in_R8) [157];
  uint ArrayIndex;
  string _msg;
  String local_50;
  
  ResDesc = GetDesc(this);
  if ((Flags >> (ResDesc->VarType & 0x1f) & 1) != 0) {
    for (ArrayIndex = 0; ArrayIndex < ResDesc->ArraySize; ArrayIndex = ArrayIndex + 1) {
      if ((Flags & BIND_SHADER_RESOURCES_KEEP_EXISTING) == 0) {
LAB_001a49a1:
        iVar1 = (*(pResourceMapping->super_IObject)._vptr_IObject[7])
                          (pResourceMapping,ResDesc->Name,(ulong)ArrayIndex);
        if ((pointer)CONCAT44(extraout_var,iVar1) == (pointer)0x0) {
          if ((Flags & BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED) != 0) {
            pIVar2 = ShaderVariableManagerGL::ImageBindInfo::Get((ImageBindInfo *)this,ArrayIndex);
            if (pIVar2 == (IDeviceObject *)0x0) {
              GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
                        (&local_50,ResDesc,ArrayIndex);
              FormatString<char[45],std::__cxx11::string,char[157]>
                        (&_msg,(Diligent *)"Unable to bind resource to shader variable \'",
                         (char (*) [45])&local_50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "\': resource is not found in the resource mapping. Do not use BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED flag to suppress the message if this is not an issue."
                         ,in_R8);
              std::__cxx11::string::~string((string *)&local_50);
              if (DebugMessageCallback != (undefined *)0x0) {
                in_R8 = (char (*) [157])0x0;
                (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0);
              }
              std::__cxx11::string::~string((string *)&_msg);
            }
          }
        }
        else {
          _msg.field_2._M_allocated_capacity = 0;
          _msg.field_2._8_8_ = 0;
          _msg._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar1);
          _msg._M_string_length._0_4_ = Flags >> 5 & 1;
          _msg._M_string_length._4_4_ = ArrayIndex;
          ShaderVariableManagerGL::ImageBindInfo::BindResource
                    ((ImageBindInfo *)this,(BindResourceInfo *)&_msg);
        }
      }
      else {
        pIVar2 = ShaderVariableManagerGL::ImageBindInfo::Get((ImageBindInfo *)this,ArrayIndex);
        if (pIVar2 == (IDeviceObject *)0x0) goto LAB_001a49a1;
      }
    }
  }
  return;
}

Assistant:

void BindResources(IResourceMapping* pResourceMapping, BIND_SHADER_RESOURCES_FLAGS Flags)
    {
        ThisImplType* const         pThis   = static_cast<ThisImplType*>(this);
        const PipelineResourceDesc& ResDesc = pThis->GetDesc();

        if ((Flags & (1u << ResDesc.VarType)) == 0)
            return;

        for (Uint32 ArrInd = 0; ArrInd < ResDesc.ArraySize; ++ArrInd)
        {
            if ((Flags & BIND_SHADER_RESOURCES_KEEP_EXISTING) != 0 && pThis->Get(ArrInd) != nullptr)
                continue;

            if (IDeviceObject* pObj = pResourceMapping->GetResource(ResDesc.Name, ArrInd))
            {
                const SET_SHADER_RESOURCE_FLAGS SetResFlags = (Flags & BIND_SHADER_RESOURCES_ALLOW_OVERWRITE) != 0 ?
                    SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE :
                    SET_SHADER_RESOURCE_FLAG_NONE;
                pThis->BindResource(BindResourceInfo{ArrInd, pObj, SetResFlags});
            }
            else
            {
                if ((Flags & BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED) && pThis->Get(ArrInd) == nullptr)
                {
                    LOG_ERROR_MESSAGE("Unable to bind resource to shader variable '",
                                      GetShaderResourcePrintName(ResDesc, ArrInd),
                                      "': resource is not found in the resource mapping. "
                                      "Do not use BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED flag to suppress the message if this is not an issue.");
                }
            }
        }
    }